

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O0

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  Expression EVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  RNNStateMachine *in_RDI;
  RNNStateMachine *this_00;
  int rcp;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar3;
  
  RNNStateMachine::transition(in_RDI,(RNNOp)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  this_00 = in_RDI + 0x18;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_RSI,(value_type_conflict2 *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar3 = *(undefined4 *)(in_RDI + 8);
  sVar2 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)this_00)
  ;
  *(int *)(in_RDI + 8) = (int)sVar2 + -1;
  EVar1 = (Expression)(**(code **)(*(long *)in_RDI + 0x60))(in_RDI,uVar3,in_RSI);
  return EVar1;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }